

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum_tests.cpp
# Opt level: O2

int scriptnum_tests::verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long in_FS_OFFSET;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CScriptNum10::serialize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,(int64_t *)ctx);
  CScriptNum::serialize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_48,(int64_t *)sig);
  bVar1 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_48);
  if (bVar1) {
    lVar2 = *(long *)ctx;
    if (lVar2 < -0x7fffffff) {
      lVar2 = -0x80000000;
    }
    if (0x7ffffffe < lVar2) {
      lVar2 = 0x7fffffff;
    }
    lVar3 = -0x80000000;
    if (-0x80000000 < *(long *)sig) {
      lVar3 = *(long *)sig;
    }
    if (0x7ffffffe < lVar3) {
      lVar3 = 0x7fffffff;
    }
    iVar4 = (int)CONCAT71((int7)((ulong)sig >> 8),lVar2 == lVar3);
  }
  else {
    iVar4 = 0;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

static bool verify(const CScriptNum10& bignum, const CScriptNum& scriptnum)
{
    return bignum.getvch() == scriptnum.getvch() && bignum.getint() == scriptnum.getint();
}